

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O3

MPP_RET rc_model_v2_hal_end(void *ctx,EncRcTask *task)

{
  int iVar1;
  
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter ctx %p task %p\n","rc_model_v2_hal_end",ctx,task);
  }
  iVar1 = *(int *)((long)ctx + 0x24c) >> 6;
  if (((ulong)task->frm & 0x10) == 0) {
    *(int *)((long)ctx + 0x238) = iVar1;
  }
  else {
    *(int *)((long)ctx + 0x234) = iVar1;
  }
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","rc_model_v2_hal_end",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET rc_model_v2_hal_end(void *ctx, EncRcTask *task)
{
    RcModelV2Ctx *p = (RcModelV2Ctx *)ctx;
    EncFrmStatus *frm = &task->frm;

    rc_dbg_func("enter ctx %p task %p\n", ctx, task);

    if (frm->is_intra)
        p->pre_i_qp = p->cur_scale_qp >> 6;
    else
        p->pre_p_qp = p->cur_scale_qp >> 6;

    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;
}